

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

DistantLight *
embree::SceneGraph::DistantLight::lerp(DistantLight *light0,DistantLight *light1,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long in_RDX;
  long in_RSI;
  DistantLight *in_RDI;
  float in_XMM0_Da;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined1 *local_430;
  undefined1 local_428 [16];
  undefined8 *local_418;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined1 *local_3f8;
  undefined8 *local_3f0;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 *local_3a0;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined1 *local_350;
  undefined1 local_348 [16];
  undefined8 *local_338;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined1 *local_318;
  undefined8 *local_310;
  undefined1 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 *local_288;
  undefined8 *local_280;
  float local_274;
  undefined1 *local_270;
  float local_264;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined1 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined1 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_148;
  undefined8 *local_140;
  float local_134;
  undefined1 *local_130;
  float local_124;
  undefined8 *local_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined1 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined1 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 *local_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_14;
  undefined4 local_10;
  float local_c;
  undefined4 local_8;
  float local_4;
  
  local_358 = (undefined8 *)(in_RSI + 0x10);
  local_360 = (undefined8 *)(in_RDX + 0x10);
  local_350 = &stack0xfffffffffffffb78;
  local_274 = 1.0 - in_XMM0_Da;
  local_328 = &local_378;
  local_318 = local_348;
  uVar1 = *local_360;
  uVar2 = *(undefined8 *)(in_RDX + 0x18);
  local_2f8._0_4_ = (float)uVar1;
  local_2f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_2f0._0_4_ = (float)uVar2;
  uStack_2f0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_2d8 = in_XMM0_Da * (float)local_2f8;
  fStack_2d4 = in_XMM0_Da * local_2f8._4_4_;
  fStack_2d0 = in_XMM0_Da * (float)uStack_2f0;
  fStack_2cc = in_XMM0_Da * uStack_2f0._4_4_;
  local_260 = &local_298;
  local_1c8 = CONCAT44(local_274,local_274);
  uStack_1c0 = CONCAT44(local_274,local_274);
  local_200 = &local_238;
  uVar3 = *local_358;
  uVar4 = *(undefined8 *)(in_RSI + 0x18);
  local_1d8._0_4_ = (float)uVar3;
  local_1d8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_1d0._0_4_ = (float)uVar4;
  uStack_1d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_1b8 = local_274 * (float)local_1d8;
  fStack_1b4 = local_274 * local_1d8._4_4_;
  fStack_1b0 = local_274 * (float)uStack_1d0;
  fStack_1ac = local_274 * uStack_1d0._4_4_;
  local_168 = CONCAT44(fStack_1b4,local_1b8);
  uStack_160 = CONCAT44(fStack_1ac,fStack_1b0);
  local_178 = (float)local_378;
  fStack_174 = (float)((ulong)local_378 >> 0x20);
  fStack_170 = (float)uStack_370;
  fStack_16c = (float)((ulong)uStack_370 >> 0x20);
  local_198 = local_1b8 + local_178;
  fStack_194 = fStack_1b4 + fStack_174;
  fStack_190 = fStack_1b0 + fStack_170;
  fStack_18c = fStack_1ac + fStack_16c;
  local_438 = (undefined8 *)(in_RSI + 0x20);
  local_440 = (undefined8 *)(in_RDX + 0x20);
  local_430 = &stack0xfffffffffffffb68;
  local_134 = 1.0 - in_XMM0_Da;
  local_408 = &local_458;
  local_3f8 = local_428;
  uVar5 = *local_440;
  uVar6 = *(undefined8 *)(in_RDX + 0x28);
  local_3d8._0_4_ = (float)uVar5;
  local_3d8._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_3d0._0_4_ = (float)uVar6;
  uStack_3d0._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_3b8 = in_XMM0_Da * (float)local_3d8;
  fStack_3b4 = in_XMM0_Da * local_3d8._4_4_;
  fStack_3b0 = in_XMM0_Da * (float)uStack_3d0;
  fStack_3ac = in_XMM0_Da * uStack_3d0._4_4_;
  local_120 = &local_158;
  local_88 = CONCAT44(local_134,local_134);
  uStack_80 = CONCAT44(local_134,local_134);
  local_d0 = &stack0xfffffffffffffb68;
  local_d8 = &local_158;
  local_a0 = &local_f8;
  uVar7 = *local_438;
  uVar8 = *(undefined8 *)(in_RSI + 0x28);
  local_98._0_4_ = (float)uVar7;
  local_98._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_90._0_4_ = (float)uVar8;
  uStack_90._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_78 = local_134 * (float)local_98;
  fStack_74 = local_134 * local_98._4_4_;
  fStack_70 = local_134 * (float)uStack_90;
  fStack_6c = local_134 * uStack_90._4_4_;
  local_60 = &local_f8;
  local_28 = CONCAT44(fStack_74,local_78);
  uStack_20 = CONCAT44(fStack_6c,fStack_70);
  local_b8 = &stack0xfffffffffffffb68;
  local_c0 = &local_f8;
  local_38 = (float)local_458;
  fStack_34 = (float)((ulong)local_458 >> 0x20);
  fStack_30 = (float)uStack_450;
  fStack_2c = (float)((ulong)uStack_450 >> 0x20);
  local_58 = local_78 + local_38;
  fStack_54 = fStack_74 + fStack_34;
  fStack_50 = fStack_70 + fStack_30;
  fStack_4c = fStack_6c + fStack_2c;
  local_40 = &stack0xfffffffffffffb68;
  local_10 = *(undefined4 *)(in_RSI + 0x30);
  local_14 = *(float *)(in_RDX + 0x30);
  local_4 = 1.0 - in_XMM0_Da;
  local_c = in_XMM0_Da * local_14;
  local_418 = local_440;
  local_400 = local_440;
  local_3f0 = local_408;
  local_3e0 = local_3f8;
  local_3d8 = uVar5;
  uStack_3d0 = uVar6;
  local_3a0 = local_408;
  local_338 = local_360;
  local_320 = local_360;
  local_310 = local_328;
  local_300 = local_318;
  local_2f8 = uVar1;
  uStack_2f0 = uVar2;
  local_2c0 = local_328;
  local_288 = local_328;
  local_280 = local_358;
  local_270 = local_350;
  local_264 = local_274;
  local_258 = local_274;
  fStack_254 = local_274;
  fStack_250 = local_274;
  fStack_24c = local_274;
  local_23c = local_274;
  local_228 = local_328;
  local_220 = local_358;
  local_218 = local_260;
  local_210 = local_350;
  local_208 = local_328;
  local_1f8 = local_350;
  local_1f0 = local_358;
  local_1e8 = local_260;
  local_1e0 = local_200;
  local_1d8 = uVar3;
  uStack_1d0 = uVar4;
  local_1a0 = local_200;
  local_180 = local_350;
  local_148 = local_408;
  local_140 = local_438;
  local_130 = local_430;
  local_124 = local_134;
  local_118 = local_134;
  fStack_114 = local_134;
  fStack_110 = local_134;
  fStack_10c = local_134;
  local_108 = local_134;
  local_e8 = local_408;
  local_e0 = local_438;
  local_c8 = local_408;
  local_b0 = local_438;
  local_a8 = local_d8;
  local_98 = uVar7;
  uStack_90 = uVar8;
  local_8 = local_10;
  local_458 = CONCAT44(fStack_3b4,local_3b8);
  uStack_450 = CONCAT44(fStack_3ac,fStack_3b0);
  local_378 = CONCAT44(fStack_2d4,local_2d8);
  uStack_370 = CONCAT44(fStack_2cc,fStack_2d0);
  local_298 = local_1c8;
  uStack_290 = uStack_1c0;
  local_238 = local_168;
  uStack_230 = uStack_160;
  local_158 = local_88;
  uStack_150 = uStack_80;
  local_f8 = local_28;
  uStack_f0 = uStack_20;
  DistantLight((DistantLight *)CONCAT44(fStack_194,local_198),
               (Vec3fa *)CONCAT44(fStack_4c,fStack_50),(Vec3fa *)CONCAT44(fStack_54,local_58),
               (float)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

static DistantLight lerp(const DistantLight& light0, const DistantLight& light1, const float f)
      {
        return DistantLight(embree::lerp(light0.D,light1.D,f),
                            embree::lerp(light0.L,light1.L,f),
                            embree::lerp(light0.halfAngle,light1.halfAngle,f));
      }